

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.h
# Opt level: O0

char * __thiscall
btGeneric6DofSpringConstraint::serialize
          (btGeneric6DofSpringConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  void *in_RDX;
  btGeneric6DofConstraint *in_RSI;
  long in_RDI;
  int i;
  btGeneric6DofSpringConstraintData *dof;
  int local_24;
  
  btGeneric6DofConstraint::serialize(in_RSI,in_RDX,(btSerializer *)in_RSI);
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    in_RSI->m_jacLinear[1].m_linearJointAxis.m_floats[(long)local_24 + 1] =
         *(btScalar *)(in_RDI + 0x53c + (long)local_24 * 4);
    in_RSI->m_jacAng[0].m_linearJointAxis.m_floats[(long)local_24 + -0x1d] =
         *(btScalar *)(in_RDI + 0x56c + (long)local_24 * 4);
    in_RSI->m_jacLinear[0].m_1MinvJt.m_floats[local_24] =
         (btScalar)(uint)((*(byte *)(in_RDI + 0x535 + (long)local_24) & 1) != 0);
    in_RSI->m_jacLinear[1].m_aJ.m_floats[(long)local_24 + 3] =
         *(btScalar *)(in_RDI + 0x554 + (long)local_24 * 4);
  }
  return "btGeneric6DofSpringConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofSpringConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpringConstraintData2* dof = (btGeneric6DofSpringConstraintData2*)dataBuffer;
	btGeneric6DofConstraint::serialize(&dof->m_6dofData,serializer);

	int i;
	for (i=0;i<6;i++)
	{
		dof->m_equilibriumPoint[i] = m_equilibriumPoint[i];
		dof->m_springDamping[i] = m_springDamping[i];
		dof->m_springEnabled[i] = m_springEnabled[i]? 1 : 0;
		dof->m_springStiffness[i] = m_springStiffness[i];
	}
	return btGeneric6DofSpringConstraintDataName;
}